

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum-dtoa.cc
# Opt level: O3

void TestBignumDtoaGayPrecision(void)

{
  BignumDtoaMode mode;
  char *__s1;
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  PrecomputedPrecision *pPVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  Vector<const_double_conversion::PrecomputedPrecision> VVar10;
  Vector<char> buffer;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff48;
  uint local_a8;
  int local_a4;
  undefined8 local_a0;
  char local_98 [104];
  
  VVar10 = double_conversion::PrecomputedPrecisionRepresentations();
  pPVar6 = VVar10.start_;
  if (0 < VVar10.length_) {
    local_a0 = VVar10._8_8_ & 0xffffffff;
    uVar9 = 0;
    do {
      mode = pPVar6[uVar9].number_digits;
      __s1 = pPVar6[uVar9].representation;
      uVar2 = pPVar6[uVar9].decimal_point;
      buffer._8_8_ = &local_a4;
      buffer.start_ = (char *)0x64;
      double_conversion::BignumDtoa
                ((double_conversion *)0x3,pPVar6[uVar9].v,mode,(int)local_98,buffer,(int *)&local_a8
                 ,in_stack_ffffffffffffff48);
      if (uVar2 != local_a8) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18b,"current_test.decimal_point","point",(ulong)uVar2,
               CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),local_a8));
        abort();
      }
      if ((int)mode < local_a4) {
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18c,"(number_digits) >= (length)");
LAB_0082a96a:
        abort();
      }
      sVar7 = strlen(local_98);
      uVar2 = (uint)sVar7;
      uVar8 = sVar7 & 0xffffffff;
      uVar3 = uVar2 + 1;
      do {
        uVar4 = (int)uVar2 >> 0x1f & uVar2;
        if ((int)uVar8 < 1) break;
        uVar3 = uVar3 - 1;
        lVar1 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        uVar4 = uVar3;
      } while (local_98[lVar1] == '0');
      local_98[(int)uVar4] = '\0';
      if (__s1 == (char *)0x0) goto LAB_0082a96a;
      iVar5 = strcmp(__s1,local_98);
      if (iVar5 != 0) {
        printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/ext/double-conversion/test/cctest/test-bignum-dtoa.cc"
               ,0x18e,"current_test.representation","buffer.start()",__s1,local_98);
        abort();
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != local_a0);
  }
  return;
}

Assistant:

TEST(BignumDtoaGayPrecision) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;

  Vector<const PrecomputedPrecision> precomputed =
      PrecomputedPrecisionRepresentations();
  for (int i = 0; i < precomputed.length(); ++i) {
    const PrecomputedPrecision current_test = precomputed[i];
    double v = current_test.v;
    int number_digits = current_test.number_digits;
    BignumDtoa(v, BIGNUM_DTOA_PRECISION, number_digits,
               buffer, &length, &point);
    CHECK_EQ(current_test.decimal_point, point);
    CHECK_GE(number_digits, length);
    TrimRepresentation(buffer);
    CHECK_EQ(current_test.representation, buffer.start());
  }
}